

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

ostream * google::protobuf::util::operator<<(ostream *os,Status *x)

{
  ostream *in_RDI;
  Status *in_stack_00000028;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  Status::ToString_abi_cxx11_(in_stack_00000028);
  std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Status& x) {
  os << x.ToString();
  return os;
}